

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::Pressure> metaf::Pressure::fromQfeString(string *s)

{
  size_type sVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  optional<metaf::Pressure> oVar5;
  
  sVar1 = s->_M_string_length;
  if ((((sVar1 == 0xb) || (sVar1 == 6)) && (pcVar2 = (s->_M_dataplus)._M_p, *pcVar2 == 'Q')) &&
     ((pcVar2[1] == 'F' && (pcVar2[2] == 'E')))) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (9 < (byte)(pcVar2[lVar4 + 3] - 0x30U)) goto LAB_001b05c2;
      uVar3 = (uint)(byte)(pcVar2[lVar4 + 3] - 0x30U) + uVar3 * 10;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 3);
    if (sVar1 == 0xb) {
      lVar4 = 0;
      do {
        if (9 < (byte)(pcVar2[lVar4 + 7] - 0x30U)) goto LAB_001b05c2;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 4);
      if (pcVar2[6] != '/') goto LAB_001b05c2;
    }
    oVar5.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Pressure>._8_8_ = 0x100000002;
    oVar5.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Pressure>._M_payload._M_value.pressureValue.
    super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
         (optional<float>)(optional<float>)((ulong)(uint)(float)uVar3 | 0x100000000);
    return (optional<metaf::Pressure>)
           oVar5.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Pressure>;
  }
LAB_001b05c2:
  return (_Optional_base<metaf::Pressure,_true,_true>)ZEXT816(0x100000000);
}

Assistant:

std::optional<Pressure> Pressure::fromQfeString(const std::string & s) {
	//static const std::regex rgx("QFE(\\d\\d\\d)(/\\d\\d\\d\\d)?");
	static const std::optional<Pressure> error;
	if (s.length() != 6 && s.length() != 11) return error;
	if (s[0] != 'Q' || s[1] != 'F' || s[2] != 'E') return error;
	const auto mmHg = strToUint(s, 3, 3);
	if (!mmHg.has_value()) return error;
	if (s.length() == 11) {
		const auto hPa = strToUint(s, 7, 4);
		if (!hPa.has_value() || s[6] != '/') return error;
		//Value in hPa is ignored (parsed only for group syntax check)
	}
	Pressure pressure;
	pressure.pressureUnit = Unit::MM_HG;
	pressure.pressureValue = *mmHg;
	return pressure;
}